

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O0

failure<toml::error_info> * toml::err<toml::error_info>(error_info *v)

{
  error_info *in_RDI;
  error_info *this;
  
  this = in_RDI;
  error_info::error_info(in_RDI,in_RDI);
  failure<toml::error_info>::failure((failure<toml::error_info> *)this,in_RDI);
  error_info::~error_info(this);
  return (failure<toml::error_info> *)this;
}

Assistant:

failure<typename std::decay<T>::type> err(T&& v)
{
    return failure<typename std::decay<T>::type>(std::forward<T>(v));
}